

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

void TR_ARITH(ast *node,C_OP *place)

{
  Operand *pOVar1;
  uint uVar2;
  ast *paVar3;
  Operand label2;
  Operand label1;
  InterCode local_1e0;
  Operand t2;
  Operand t1;
  
  uVar2 = IrSim::ast2ic((IrSim *)node,node);
  if ((uVar2 < 0x1c) && ((0xff04000U >> (uVar2 & 0x1f) & 1) != 0)) {
    IrSim::newLabel(&label1,&irSim);
    IrSim::newLabel(&label2,&irSim);
    IrSim::icAssign(&local_1e0,&irSim,place,&OP_ZERO);
    IrSim::commitIc(&irSim,&local_1e0);
    InterCode::~InterCode(&local_1e0);
    TR_Cond(node,&label1,&label2);
    IrSim::icLabel(&local_1e0,&irSim,&label1);
    IrSim::commitIc(&irSim,&local_1e0);
    IrSim::icAssign((InterCode *)&t1,&irSim,place,&OP_ONE);
    IrSim::commitIc(&irSim,(C_IC *)&t1);
    IrSim::icLabel((InterCode *)&t2,&irSim,&label2);
    IrSim::commitIc(&irSim,(C_IC *)&t2);
    InterCode::~InterCode((InterCode *)&t2);
    InterCode::~InterCode((InterCode *)&t1);
    InterCode::~InterCode(&local_1e0);
    std::__cxx11::string::~string((string *)&label2.value);
    pOVar1 = &label1;
  }
  else {
    IrSim::newTmpVar(&t1,&irSim);
    IrSim::newTmpVar(&t2,&irSim);
    paVar3 = sibling(node,-1);
    TR_Exp(paVar3,&t1);
    paVar3 = sibling(node,1);
    TR_Exp(paVar3,&t2);
    IrSim::icArith(&local_1e0,&irSim,node,place,&t1,&t2);
    IrSim::commitIc(&irSim,&local_1e0);
    InterCode::~InterCode(&local_1e0);
    std::__cxx11::string::~string((string *)&t2.value);
    pOVar1 = &t1;
  }
  std::__cxx11::string::~string((string *)&pOVar1->value);
  return;
}

Assistant:

static void TR_ARITH(ast *node, C_OP &place) {
    int type = irSim.ast2ic(node);
    if (irSim.isGoto(type)) {
        Operand label1 = irSim.newLabel(), label2 = irSim.newLabel();
        irSim << irSim.icAssign(place, OP_ZERO);
        TR_Cond(node, label1, label2);
        irSim << irSim.icLabel(label1) << irSim.icAssign(place, OP_ONE) << irSim.icLabel(label2);
        return;
    }
    Operand t1 = irSim.newTmpVar(), t2 = irSim.newTmpVar();
    TR_Exp(sibling(node, -1), t1);
    TR_Exp(sibling(node, 1), t2);
    irSim << irSim.icArith(node, place, t1, t2);
}